

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  const_reference pvVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  TestError *pTVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  float fVar13;
  MessageBuilder local_698;
  MessageBuilder local_518;
  MessageBuilder local_398;
  MessageBuilder local_218;
  GLuint local_94;
  GLuint local_90;
  GLint shader_id_te;
  GLint shader_id_tc;
  GLenum local_80;
  GLenum local_7c;
  GLint shader_type_te;
  GLint shader_type_tc;
  Functions *gl;
  reference local_68;
  _run *run;
  __normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
  local_58;
  __normal_iterator<const_glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
  local_50;
  _runs_const_iterator run_iterator;
  GLint n_invocation;
  float epsilon;
  _ivec4 reference_result_value2;
  _vec2 reference_result_value1;
  _vec4 reference_result_position;
  float reference_result_pointsize;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this_local;
  
  unique0x1000121f = this;
  initTest(this);
  reference_result_position.z = 0.0;
  _vec4::_vec4((_vec4 *)&reference_result_value1,0.0,0.0,0.0,0.0);
  _vec2::_vec2((_vec2 *)&reference_result_value2.z,0.0,0.0);
  _ivec4::_ivec4((_ivec4 *)&n_invocation,0,0,0,0);
  for (run_iterator._M_current._4_4_ = 0;
      run_iterator._M_current._4_4_ < this->m_gl_max_patch_vertices_value;
      run_iterator._M_current._4_4_ = run_iterator._M_current._4_4_ + 1) {
    reference_result_position.z =
         1.0 / (float)(run_iterator._M_current._4_4_ + 1) + reference_result_position.z;
    reference_result_value1.x =
         (float)(run_iterator._M_current._4_4_ << 2) + reference_result_value1.x;
    reference_result_value1.y =
         (float)(run_iterator._M_current._4_4_ * 4 + 1) + reference_result_value1.y;
    reference_result_position.x =
         (float)(run_iterator._M_current._4_4_ * 4 + 2) + reference_result_position.x;
    reference_result_position.y =
         (float)(run_iterator._M_current._4_4_ * 4 + 3) + reference_result_position.y;
    reference_result_value2.z =
         (int)(1.0 / (float)(run_iterator._M_current._4_4_ + 1) + (float)reference_result_value2.z);
    reference_result_value2.w =
         (int)(1.0 / (float)(run_iterator._M_current._4_4_ + 2) + (float)reference_result_value2.w);
    n_invocation = run_iterator._M_current._4_4_ + 1 + n_invocation;
    epsilon = (float)(run_iterator._M_current._4_4_ + 2 + (int)epsilon);
    reference_result_value2.x = run_iterator._M_current._4_4_ + 3 + reference_result_value2.x;
    reference_result_value2.y = run_iterator._M_current._4_4_ + 4 + reference_result_value2.y;
  }
  local_58._M_current =
       (_run *)std::
               vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
               ::begin(&this->m_runs);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_const*,std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>>>
  ::__normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run*>
            ((__normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_const*,std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>>>
              *)&local_50,&local_58);
  do {
    run = (_run *)std::
                  vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
                  ::end(&this->m_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
                        *)&run);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
               ::operator*(&local_50);
    gl = (Functions *)
         std::
         vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
         ::begin(&this->m_runs);
    bVar1 = __gnu_cxx::operator==
                      (&local_50,
                       (__normal_iterator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
                        *)&gl);
    if (bVar1) {
      pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
      iVar2 = (*pRVar4->_vptr_RenderContext[3])();
      _shader_type_te = CONCAT44(extraout_var,iVar2);
      local_7c = 0;
      local_80 = 0;
      (**(code **)(_shader_type_te + 0xa70))(local_68->tc_id,0x8b4f,&local_7c);
      (**(code **)(_shader_type_te + 0xa70))(local_68->te_id,0x8b4f,&local_80);
      dVar3 = (**(code **)(_shader_type_te + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xbc4);
      if (local_7c != (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Invalid shader type reported by glGetShaderiv() for a tessellation control shader"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbc8);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (local_80 != (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbcd);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_90 = 0;
      local_94 = 0;
      (**(code **)(_shader_type_te + 0x9a0))
                (local_68->pipeline_object_id,
                 (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER,&local_90);
      (**(code **)(_shader_type_te + 0x9a0))
                (local_68->pipeline_object_id,
                 (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER,&local_94);
      dVar3 = (**(code **)(_shader_type_te + 0x800))();
      glu::checkError(dVar3,
                      "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / GL_TESS_EVALUATION_SHADER_EXT enum(s)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xbd8);
      if (local_90 != local_68->tc_program_id) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Invalid separate program object ID reported for Tessellation Control stage",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbdc);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (local_94 != local_68->te_program_id) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Invalid separate program object ID reported for Tessellation Evaluation stage",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbe1);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    if (((local_68->point_mode & 1U) != 0) &&
       (sVar5 = std::vector<float,_std::allocator<float>_>::size(&local_68->result_pointsize_data),
       sVar5 != 1)) {
LAB_0161344f:
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_218,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_218,
                          (char (*) [57])"Tessellation Evaluation stage set gl_PointSize value to ")
      ;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_68->result_pointsize_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar6);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [28])" instead of expected value ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_position.z);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_218);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Invalid gl_PointSize data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xbef);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if ((local_68->point_mode & 1U) != 0) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_68->result_pointsize_data,0);
      fVar13 = de::abs<float>(*pvVar6 - reference_result_position.z);
      if (1e-05 < fVar13) goto LAB_0161344f;
    }
    sVar5 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::size
                      (&local_68->result_position_data);
    if (sVar5 != 1) {
LAB_016135e0:
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_398,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_398,
                          (char (*) [50])"Tessellation Evaluation stage set gl_Position to ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2afcbee);
      pvVar10 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::operator[]
                          (&local_68->result_position_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar10 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::operator[]
                          (&local_68->result_position_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->y);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar10 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::operator[]
                          (&local_68->result_position_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->z);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar10 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::operator[]
                          (&local_68->result_position_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->w);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [31])" ) instead of expected value (");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_value1.x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_value1.y);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_position.x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_position.y);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_398);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc00);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pvVar10 = std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::operator[]
                        (&local_68->result_position_data,0);
    bVar1 = _vec4::operator!=(pvVar10,(_vec4 *)&reference_result_value1);
    if (bVar1) goto LAB_016135e0;
    sVar5 = std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::size
                      (&local_68->result_value1_data);
    if (sVar5 != 1) {
LAB_01613963:
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_518,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_518,
                          (char (*) [48])"Tessellation Evaluation stage set te_value1 to ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2afcbee);
      pvVar11 = std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::operator[]
                          (&local_68->result_value1_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar11->x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar11 = std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::operator[]
                          (&local_68->result_value1_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar11->y);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [31])" ) instead of expected value (");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(float *)&reference_result_value2.z);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(float *)&reference_result_value2.w);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_518);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc11);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pvVar11 = std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::operator[]
                        (&local_68->result_value1_data,0);
    fVar13 = de::abs<float>(pvVar11->x - (float)reference_result_value2.z);
    if (1e-05 < fVar13) goto LAB_01613963;
    pvVar11 = std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::operator[]
                        (&local_68->result_value1_data,0);
    fVar13 = de::abs<float>(pvVar11->y - (float)reference_result_value2.w);
    if (1e-05 < fVar13) goto LAB_01613963;
    sVar5 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::size
                      (&local_68->result_value2_data);
    if (sVar5 != 1) {
LAB_01613bb0:
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_698,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_698,
                          (char (*) [48])"Tessellation Evaluation stage set te_value2 to ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2afcbee);
      pvVar12 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::operator[]
                          (&local_68->result_value2_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar12->x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar12 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::operator[]
                          (&local_68->result_value2_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar12->y);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar12 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::operator[]
                          (&local_68->result_value2_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar12->z);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pvVar12 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::operator[]
                          (&local_68->result_value2_data,0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar12->w);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [31])" ) instead of expected value (");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&n_invocation);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&epsilon);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_value2.x);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&reference_result_value2.y);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_698);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Invalid value2 data saved in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc22);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pvVar12 = std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::operator[]
                        (&local_68->result_value2_data,0);
    bVar1 = _ivec4::operator!=(pvVar12,(_ivec4 *)&n_invocation);
    if (bVar1) goto LAB_01613bb0;
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run_*,_std::vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>_>
    ::operator++(&local_50,0);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Calculate reference values that should be generated for all runs */
	float		reference_result_pointsize(0);
	_vec4		reference_result_position(0, 0, 0, 0);
	_vec2		reference_result_value1(0, 0);
	_ivec4		reference_result_value2(0, 0, 0, 0);
	const float epsilon = (float)1e-5;

	for (glw::GLint n_invocation = 0; n_invocation < m_gl_max_patch_vertices_value; ++n_invocation)
	{
		/* As per TC and TE shaders */
		reference_result_pointsize += 1.0f / static_cast<float>(n_invocation + 1);

		reference_result_position.x += static_cast<float>(n_invocation * 4 + 0);
		reference_result_position.y += static_cast<float>(n_invocation * 4 + 1);
		reference_result_position.z += static_cast<float>(n_invocation * 4 + 2);
		reference_result_position.w += static_cast<float>(n_invocation * 4 + 3);

		reference_result_value1.x += 1.0f / static_cast<float>(n_invocation + 1);
		reference_result_value1.y += 1.0f / static_cast<float>(n_invocation + 2);

		reference_result_value2.x += (n_invocation + 1);
		reference_result_value2.y += (n_invocation + 2);
		reference_result_value2.z += (n_invocation + 3);
		reference_result_value2.w += (n_invocation + 4);
	}

	/* Iterate through test runs and analyse the result data */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* For the very first run, make sure that the type of tessellation shader objects
		 * is reported correctly for both program and pipeline object cases.
		 */
		if (run_iterator == m_runs.begin())
		{
			const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
			glw::GLint			  shader_type_tc = GL_NONE;
			glw::GLint			  shader_type_te = GL_NONE;

			/* Program objects first */
			gl.getShaderiv(run.tc_id, GL_SHADER_TYPE, &shader_type_tc);
			gl.getShaderiv(run.te_id, GL_SHADER_TYPE, &shader_type_te);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call(s) failed");

			if ((glw::GLenum)shader_type_tc != m_glExtTokens.TESS_CONTROL_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation control shader");
			}

			if ((glw::GLenum)shader_type_te != m_glExtTokens.TESS_EVALUATION_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader");
			}

			/* Let's query the pipeline object now */
			glw::GLint shader_id_tc = 0;
			glw::GLint shader_id_te = 0;

			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_CONTROL_SHADER, &shader_id_tc);
			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_EVALUATION_SHADER, &shader_id_te);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / "
											   "GL_TESS_EVALUATION_SHADER_EXT enum(s)");

			if ((glw::GLuint)shader_id_tc != run.tc_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Control stage");
			}

			if ((glw::GLuint)shader_id_te != run.te_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Evaluation stage");
			}
		}

		if ((run.point_mode && run.result_pointsize_data.size() != 1) ||
			(run.point_mode && de::abs(run.result_pointsize_data[0] - reference_result_pointsize) > epsilon))
		{
			/* It is a test bug if result_pointsize_data.size() == 0 */
			DE_ASSERT(run.result_pointsize_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_PointSize value to "
							   << run.result_pointsize_data[0] << " instead of expected value "
							   << reference_result_pointsize << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_PointSize data exposed in TE stage");
		}

		if (run.result_position_data.size() != 1 || run.result_position_data[0] != reference_result_position)
		{
			/* It is a test bug if result_position_data.size() == 0 */
			DE_ASSERT(run.result_position_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_Position to "
							   << " (" << run.result_position_data[0].x << ", " << run.result_position_data[0].y << ", "
							   << run.result_position_data[0].z << ", " << run.result_position_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_position.x << ", " << reference_result_position.y << ", "
							   << reference_result_position.z << ", " << reference_result_position.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value1_data.size() != 1 ||
			de::abs(run.result_value1_data[0].x - reference_result_value1.x) > epsilon ||
			de::abs(run.result_value1_data[0].y - reference_result_value1.y) > epsilon)
		{
			/* It is a test bug if result_value1_data.size() == 0 */
			DE_ASSERT(run.result_value1_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value1 to "
							   << " (" << run.result_value1_data[0].x << ", " << run.result_value1_data[0].y
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value1.x << ", " << reference_result_value1.y << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value2_data.size() != 1 || run.result_value2_data[0] != reference_result_value2)
		{
			/* It is a test bug if result_value2_data.size() == 0 */
			DE_ASSERT(run.result_value2_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value2 to "
							   << " (" << run.result_value2_data[0].x << ", " << run.result_value2_data[0].y << ", "
							   << run.result_value2_data[0].z << ", " << run.result_value2_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value2.x << ", " << reference_result_value2.y << ", "
							   << reference_result_value2.z << ", " << reference_result_value2.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value2 data saved in TE stage");
		}
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}